

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O3

int omac_acpkm_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  CMAC_ACPKM_CTX *ctx_00;
  uint inl;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  EVP_CIPHER *pEVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  uchar *ptr;
  ulong len;
  uchar mac [16];
  byte local_78 [16];
  uchar *local_68;
  undefined8 local_60;
  byte local_58 [40];
  
  puVar3 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  if (*(int *)(puVar3 + 3) == 0) {
    ERR_GOST_error(0x91,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                   ,0x160);
    iVar2 = 0;
  }
  else {
    ctx_00 = (CMAC_ACPKM_CTX *)*puVar3;
    iVar2 = 0;
    if (ctx_00->nlast_block != -1) {
      inl = EVP_CIPHER_CTX_get_block_size(ctx_00->cctx);
      len = (ulong)inl;
      iVar2 = 0;
      if ((inl == 8) || (inl == 0x10)) {
        local_60 = (long)ctx_00->nlast_block;
        iVar1 = CMAC_ACPKM_Mesh(ctx_00);
        if (iVar1 != 0) {
          pEVar4 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)ctx_00->actx);
          iVar2 = EVP_CIPHER_get_key_length(pEVar4);
          local_68 = ctx_00->km;
          lVar6 = (long)iVar2;
          ptr = ctx_00->km + lVar6;
          uVar7 = 0;
          do {
            bVar5 = ctx_00->km[uVar7 + lVar6] * '\x02';
            local_58[uVar7] = bVar5;
            if ((uVar7 < inl - 1) && ((char)ctx_00->km[uVar7 + lVar6 + 1] < '\0')) {
              local_58[uVar7] = bVar5 | 1;
            }
            uVar7 = uVar7 + 1;
          } while (len != uVar7);
          if ((char)*ptr < '\0') {
            bVar5 = 0x1b;
            if (inl == 0x10) {
              bVar5 = 0x87;
            }
            local_58[(long)(int)inl + -1] = local_58[(long)(int)inl + -1] ^ bVar5;
          }
          if (inl == (uint)local_60) {
            if (0 < (int)inl) {
              uVar7 = 0;
              do {
                local_78[uVar7] = ptr[uVar7] ^ ctx_00->last_block[uVar7];
                uVar7 = uVar7 + 1;
              } while (len != uVar7);
            }
          }
          else {
            ctx_00->last_block[local_60] = 0x80;
            iVar2 = inl - (uint)local_60;
            if (1 < iVar2) {
              memset(ctx_00->last_block + local_60 + 1,0,(ulong)(iVar2 - 1));
            }
            if (0 < (int)inl) {
              uVar7 = 0;
              do {
                local_78[uVar7] = local_58[uVar7] ^ ctx_00->last_block[uVar7];
                uVar7 = uVar7 + 1;
              } while (len != uVar7);
            }
          }
          OPENSSL_cleanse(ptr,len);
          OPENSSL_cleanse(local_58,len);
          OPENSSL_cleanse(local_68,0x30);
          iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,local_78,local_78,inl);
          iVar2 = 1;
          if (iVar1 == 0) {
            OPENSSL_cleanse(local_78,len);
            iVar2 = 0;
          }
        }
      }
      else {
        ERR_GOST_error(0x91,0x74,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                       ,0x106);
      }
    }
    memcpy(md,local_78,puVar3[1]);
  }
  return iVar2;
}

Assistant:

int omac_acpkm_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    unsigned char mac[MAX_GOST_OMAC_ACPKM_SIZE];
    size_t mac_size = sizeof(mac);
    int ret;

    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    ret = CMAC_ACPKM_Final(c->cmac_ctx, mac, &mac_size);

    memcpy(md, mac, c->dgst_size);
    return ret;
}